

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

string * __thiscall
pbrt::RandomWalkIntegrator::ToString_abi_cxx11_
          (string *__return_storage_ptr__,RandomWalkIntegrator *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<int_const&>
            (__return_storage_ptr__,"[ RandomWalkIntegrator maxDepth: %d ]",&this->maxDepth);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomWalkIntegrator::ToString() const {
    return StringPrintf("[ RandomWalkIntegrator maxDepth: %d ]", maxDepth);
}